

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,
          tag_t<cfgfile::string_trait_t> *parent,child_tags_list_t *list)

{
  pointer pptVar1;
  bool bVar2;
  exception_t<cfgfile::string_trait_t> *this_00;
  pointer pptVar3;
  allocator local_2bd;
  allocator local_2bc;
  allocator local_2bb;
  allocator local_2ba;
  allocator local_2b9;
  lexeme_t<cfgfile::string_trait_t> lexeme;
  string local_290 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(&lexeme,&this->m_lex);
  pptVar3 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar1 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pptVar3 == pptVar1) {
      this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                (local_170,"Unexpected tag name. We expected one child tag of tag \"",&local_2b9);
      std::__cxx11::string::string((string *)&local_150,local_170);
      std::operator+(&local_130,&local_150,&parent->m_name);
      std::__cxx11::string::string(local_1b0,"\", but we\'ve got \"",&local_2ba);
      std::__cxx11::string::string((string *)&local_190,local_1b0);
      std::operator+(&local_110,&local_130,&local_190);
      std::operator+(&local_f0,&local_110,&lexeme.m_value);
      std::__cxx11::string::string(local_1f0,"\". In file \"",&local_2bb);
      std::__cxx11::string::string((string *)&local_1d0,local_1f0);
      std::operator+(&local_d0,&local_f0,&local_1d0);
      std::operator+(&local_b0,&local_d0,&((this->m_lex).m_stream)->m_file_name);
      std::__cxx11::string::string(local_230,"\" on line ",&local_2bc);
      std::__cxx11::string::string((string *)&local_210,local_230);
      std::operator+(&local_90,&local_b0,&local_210);
      std::__cxx11::to_string(&local_250,(this->m_lex).m_line_number);
      std::operator+(&local_70,&local_90,&local_250);
      std::__cxx11::string::string(local_290,".",&local_2bd);
      std::__cxx11::string::string((string *)&local_270,local_290);
      std::operator+(&local_50,&local_70,&local_270);
      exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
      __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
    bVar2 = start_tag_parsing(this,&lexeme,*pptVar3);
    pptVar3 = pptVar3 + 1;
  } while (!bVar2);
  std::__cxx11::string::~string((string *)&lexeme.m_value);
  return;
}

Assistant:

void start_tag_parsing( const tag_t< Trait > & parent,
		const typename tag_t< Trait >::child_tags_list_t & list )
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		bool tag_found = false;

		for( tag_t< Trait > * tag : list )
		{
			if( start_tag_parsing( lexeme, *tag ) )
			{
				tag_found = true;

				break;
			}
		}

		if( !tag_found )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected one child tag of tag \"" ) +
				parent.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
	}